

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal.cpp
# Opt level: O1

void __thiscall unodb::detail::dump_val(detail *this,ostream *os,value_view v)

{
  ostream *poVar1;
  pointer pbVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"val(",4);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)this);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"): 0x",5);
  if (v._M_ptr != (pointer)0x0) {
    pbVar2 = (pointer)0x0;
    do {
      dump_byte((ostream *)this,(byte)os[(long)pbVar2]);
      pbVar2 = pbVar2 + 1;
    } while (v._M_ptr != pbVar2);
  }
  return;
}

Assistant:

[[gnu::cold]] UNODB_DETAIL_NOINLINE void dump_val(std::ostream &os,
                                                  unodb::value_view v) {
  const auto sz = v.size_bytes();
  os << "val(" << sz << "): 0x";
  for (std::size_t i = 0; i < sz; ++i) dump_byte(os, v[i]);
}